

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O1

void __thiscall
script_segwit_tests::IsWitnessProgram_Invalid_Pushdata::test_method
          (IsWitnessProgram_Invalid_Pushdata *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  check_type cVar3;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  lazy_ostream local_c8;
  undefined1 *local_b8;
  char **local_b0;
  assertion_result local_a8;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_3_ = 0x204c00;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_70,__l,(allocator_type *)&local_c8);
  local_58.indirect_contents.indirect =
       (char *)((ulong)local_58.indirect_contents.indirect & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&local_70,
             (iterator)
             local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x20,(value_type_conflict3 *)local_58.direct);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x99;
  file.m_begin = (iterator)&local_80;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_90,msg);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       anon_unknown_20::IsNoWitnessProgram((CScript *)&local_58.indirect_contents);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "IsNoWitnessProgram(CScript(bytes.begin(), bytes.end()))";
  local_d0 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_e0 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_b0 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_c8,1,0,WARN,_cVar3,(size_t)&local_e8,0x99);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  local_58._0_4_ = 0x204d00;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,&local_58);
  local_58.indirect_contents.indirect =
       (char *)((ulong)local_58.indirect_contents.indirect & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&local_70,
             (iterator)
             local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x20,(value_type_conflict3 *)local_58.direct);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x9d;
  file_00.m_begin = (iterator)&local_f8;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_108,
             msg_00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       anon_unknown_20::IsNoWitnessProgram((CScript *)&local_58.indirect_contents);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "IsNoWitnessProgram(CScript(bytes.begin(), bytes.end()))";
  local_d0 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_110 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_b0 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_c8,1,0,WARN,_cVar3,(size_t)&local_118,0x9d);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  local_58._0_6_ = 0x204e00;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_70,&local_58);
  local_58.indirect_contents.indirect =
       (char *)((ulong)local_58.indirect_contents.indirect & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&local_70,
             (iterator)
             local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,0x20,(value_type_conflict3 *)local_58.direct);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xa1;
  file_01.m_begin = (iterator)&local_128;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
             msg_01);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       anon_unknown_20::IsNoWitnessProgram((CScript *)&local_58.indirect_contents);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8 = "IsNoWitnessProgram(CScript(bytes.begin(), bytes.end()))";
  local_d0 = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
  ;
  local_140 = "";
  local_b0 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_c8,1,0,WARN,_cVar3,(size_t)&local_148,0xa1);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
    local_58.indirect_contents.indirect = (char *)0x0;
  }
  if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsWitnessProgram_Invalid_Pushdata)
{
    // A script is no witness program if OP_PUSHDATA is used to push the hash.
    std::vector<unsigned char> bytes = {OP_0, OP_PUSHDATA1, 32};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(IsNoWitnessProgram(CScript(bytes.begin(), bytes.end())));

    bytes = {OP_0, OP_PUSHDATA2, 32, 0};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(IsNoWitnessProgram(CScript(bytes.begin(), bytes.end())));

    bytes = {OP_0, OP_PUSHDATA4, 32, 0, 0, 0};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(IsNoWitnessProgram(CScript(bytes.begin(), bytes.end())));
}